

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O2

bool wabt::operator<(OpcodeInfo *lhs,OpcodeInfo *rhs)

{
  Enum EVar1;
  Enum EVar2;
  bool bVar3;
  
  EVar1 = (lhs->opcode_).enum_;
  EVar2 = (rhs->opcode_).enum_;
  bVar3 = true;
  if (EVar2 <= EVar1) {
    if (EVar1 <= EVar2) {
      if ((int)lhs->kind_ < (int)rhs->kind_) {
        return true;
      }
      if ((int)lhs->kind_ <= (int)rhs->kind_) {
        bVar3 = std::operator<(&lhs->data_,&rhs->data_);
        if (bVar3) {
          return true;
        }
        std::operator<(&rhs->data_,&lhs->data_);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

std::pair<const T*, size_t> OpcodeInfo::GetDataArray() const {
  if (data_.empty()) {
    return std::pair<const T*, size_t>(nullptr, 0);
  }

  assert(data_.size() % sizeof(T) == 0);
  return std::make_pair(reinterpret_cast<const T*>(data_.data()),
                        data_.size() / sizeof(T));
}